

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall polyscope::render::Engine::buildEngineGui(Engine *this)

{
  bool bVar1;
  int iVar2;
  ImVec2 *size_arg;
  int *piVar3;
  reference pvVar4;
  long in_RDI;
  string cmapName;
  string filename_2;
  size_t buffLen_1;
  string fileext;
  string filebase;
  string matName_1;
  string filename_1;
  string matName;
  string filename;
  size_t buffLen;
  string mName;
  TransparencyMode m;
  const_iterator __end5;
  const_iterator __begin5;
  initializer_list<polyscope::TransparencyMode> *__range5;
  ImVec2 *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  allocator *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  allocator_type *in_stack_fffffffffffffbc0;
  size_type in_stack_fffffffffffffbc8;
  void *__n;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  vector<char,_std::allocator<char>_> *this_00;
  void *in_stack_fffffffffffffbd8;
  ImGuiInputTextCallback in_stack_fffffffffffffbe0;
  int *in_stack_fffffffffffffbe8;
  ImGuiInputTextFlags flags;
  char *in_stack_fffffffffffffbf0;
  TransparencyMode *in_stack_fffffffffffffbf8;
  allocator *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffc08;
  string *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  ImGuiSelectableFlags in_stack_fffffffffffffc70;
  string *label;
  undefined7 in_stack_fffffffffffffc80;
  byte in_stack_fffffffffffffc87;
  string local_368 [32];
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [36];
  ImVec2 local_2d4;
  undefined1 local_2ca [2];
  void *local_2c8;
  string local_2c0 [32];
  string local_2a0 [12];
  ImGuiComboFlags in_stack_fffffffffffffd6c;
  char *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  string local_280 [28];
  ImGuiColorEditFlags in_stack_fffffffffffffd9c;
  float *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  string local_250 [32];
  char local_230 [64];
  string local_1f0 [32];
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  undefined1 local_181 [33];
  ImVec2 local_160;
  string local_158 [32];
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  undefined1 local_e9 [37];
  ImVec2 local_c4;
  undefined1 local_ba [2];
  string *local_b8;
  int local_b0 [2];
  ImVec2 local_a8;
  string local_a0 [36];
  TransparencyMode local_7c;
  const_iterator local_78;
  const_iterator local_70;
  TransparencyMode local_64 [3];
  initializer_list<polyscope::TransparencyMode> local_58;
  initializer_list<polyscope::TransparencyMode> *local_48;
  string local_40 [55];
  allocator local_9 [9];
  
  ImGui::SetNextTreeNodeOpen(false,0x3667ab);
  bVar1 = ImGui::TreeNode((char *)in_stack_fffffffffffffba8);
  if (bVar1) {
    ImGui::PushItemWidth((float)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
    if ((buildEngineGui()::displayBackgroundName_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&buildEngineGui()::displayBackgroundName_abi_cxx11_), iVar2 != 0
       )) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&buildEngineGui()::displayBackgroundName_abi_cxx11_,"None",local_9);
      std::allocator<char>::~allocator((allocator<char> *)local_9);
      __cxa_atexit(std::__cxx11::string::~string,&buildEngineGui()::displayBackgroundName_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&buildEngineGui()::displayBackgroundName_abi_cxx11_);
    }
    ImGui::ColorEdit4(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c)
    ;
    ImGui::SetNextTreeNodeOpen(false,0x366870);
    bVar1 = ImGui::TreeNode((char *)in_stack_fffffffffffffba8);
    if (bVar1) {
      label = local_40;
      modeName_abi_cxx11_(in_stack_fffffffffffffbf8);
      std::__cxx11::string::c_str();
      in_stack_fffffffffffffc87 =
           ImGui::BeginCombo(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                             in_stack_fffffffffffffd6c);
      std::__cxx11::string::~string(local_40);
      if ((in_stack_fffffffffffffc87 & 1) != 0) {
        local_64[0] = None;
        local_64[1] = 1;
        local_64[2] = 2;
        local_58._M_array = local_64;
        local_58._M_len = 3;
        local_48 = &local_58;
        local_70 = std::initializer_list<polyscope::TransparencyMode>::begin(local_48);
        local_78 = std::initializer_list<polyscope::TransparencyMode>::end
                             ((initializer_list<polyscope::TransparencyMode> *)
                              in_stack_fffffffffffffbb0);
        for (; local_70 != local_78; local_70 = local_70 + 1) {
          local_7c = *local_70;
          modeName_abi_cxx11_(in_stack_fffffffffffffbf8);
          size_arg = (ImVec2 *)std::__cxx11::string::c_str();
          bVar1 = *(TransparencyMode *)(in_RDI + 0x240) == local_7c;
          ImVec2::ImVec2(&local_a8,0.0,0.0);
          bVar1 = ImGui::Selectable((char *)label,bVar1,in_stack_fffffffffffffc70,size_arg);
          if (bVar1) {
            options::transparencyMode = local_7c;
            requestRedraw();
          }
          std::__cxx11::string::~string(local_a0);
        }
        ImGui::EndCombo();
      }
      iVar2 = *(int *)(in_RDI + 0x240);
      if (iVar2 == 0) {
        ImGui::TextWrapped("Transparency effects are disabled and all related options are ignored.")
        ;
      }
      else if (iVar2 == 1) {
        ImGui::TextWrapped(
                          "Simple transparent rendering. Efficient, but objects at different depths may not look right."
                          );
      }
      else if (iVar2 == 2) {
        ImGui::TextWrapped(
                          "Accurate but expensive transparent rendering. Increase the number of passes to resolve complicated scenes."
                          );
        bVar1 = ImGui::InputInt(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                                (int)in_stack_fffffffffffffbe0,
                                (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
        if (bVar1) {
          requestRedraw();
        }
      }
      ImGui::TreePop();
    }
    GroundPlane::buildGui
              ((GroundPlane *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    ImGui::SetNextTreeNodeOpen(false,0x366bab);
    bVar1 = ImGui::TreeNode((char *)in_stack_fffffffffffffba8);
    if (bVar1) {
      ImGui::SliderFloat((char *)in_stack_fffffffffffffbc0,(float *)in_stack_fffffffffffffbb8,
                         (float)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                         SUB84(in_stack_fffffffffffffbb0,0),(char *)in_stack_fffffffffffffba8,0.0);
      ImGui::SliderFloat((char *)in_stack_fffffffffffffbc0,(float *)in_stack_fffffffffffffbb8,
                         (float)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                         SUB84(in_stack_fffffffffffffbb0,0),(char *)in_stack_fffffffffffffba8,0.0);
      ImGui::SliderFloat((char *)in_stack_fffffffffffffbc0,(float *)in_stack_fffffffffffffbb8,
                         (float)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                         SUB84(in_stack_fffffffffffffbb0,0),(char *)in_stack_fffffffffffffba8,0.0);
      ImGui::TreePop();
    }
    ImGui::SetNextTreeNodeOpen(false,0x366c73);
    bVar1 = ImGui::TreeNode((char *)in_stack_fffffffffffffba8);
    if (bVar1) {
      bVar1 = ImGui::InputInt(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                              (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                              (int)in_stack_fffffffffffffbe0,
                              (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      if (bVar1) {
        local_b0[1] = 4;
        piVar3 = std::min<int>((int *)(in_RDI + 0x224),local_b0 + 1);
        *(int *)(in_RDI + 0x224) = *piVar3;
        local_b0[0] = 1;
        piVar3 = std::max<int>((int *)(in_RDI + 0x224),local_b0);
        *(int *)(in_RDI + 0x224) = *piVar3;
        options::ssaaFactor = *(undefined4 *)(in_RDI + 0x224);
        requestRedraw();
      }
      ImGui::TreePop();
    }
    flags = (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
    ImGui::SetNextTreeNodeOpen(false,0x366d44);
    bVar1 = ImGui::TreeNode((char *)in_stack_fffffffffffffba8);
    if (bVar1) {
      ImGui::SetNextTreeNodeOpen(false,0x366d65);
      bVar1 = ImGui::TreeNode((char *)in_stack_fffffffffffffba8);
      if (bVar1) {
        local_b8 = (string *)0x200;
        if ((buildEngineGui()::buffName == '\0') &&
           (iVar2 = __cxa_guard_acquire(&buildEngineGui()::buffName), iVar2 != 0)) {
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
          std::allocator<char>::~allocator((allocator<char> *)(local_ba + 1));
          __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui::buffName,
                       &__dso_handle);
          __cxa_guard_release(&buildEngineGui()::buffName);
        }
        std::vector<char,_std::allocator<char>_>::operator[](&buildEngineGui::buffName,0);
        ImGui::InputText((char *)in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
                         (size_t)in_stack_fffffffffffffbf0,flags,in_stack_fffffffffffffbe0,
                         in_stack_fffffffffffffbd8);
        if ((buildEngineGui()::buffFile == '\0') &&
           (iVar2 = __cxa_guard_acquire(&buildEngineGui()::buffFile), iVar2 != 0)) {
          in_stack_fffffffffffffc40 = (string *)local_ba;
          in_stack_fffffffffffffc38 = local_b8;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
          std::allocator<char>::~allocator((allocator<char> *)local_ba);
          __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui::buffFile,
                       &__dso_handle);
          __cxa_guard_release(&buildEngineGui()::buffFile);
        }
        std::vector<char,_std::allocator<char>_>::operator[](&buildEngineGui::buffFile,0);
        ImGui::InputText((char *)in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
                         (size_t)in_stack_fffffffffffffbf0,flags,in_stack_fffffffffffffbe0,
                         in_stack_fffffffffffffbd8);
        ImVec2::ImVec2(&local_c4,0.0,0.0);
        bVar1 = ImGui::Button((char *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        if (bVar1) {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&buildEngineGui::buffFile,0)
          ;
          in_stack_fffffffffffffc30 = (string *)local_e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_e9 + 1),pvVar4,(allocator *)in_stack_fffffffffffffc30);
          std::allocator<char>::~allocator((allocator<char> *)local_e9);
          in_stack_fffffffffffffc18 =
               (string *)
               std::vector<char,_std::allocator<char>_>::operator[](&buildEngineGui::buffName,0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_110,(char *)in_stack_fffffffffffffc18,&local_111);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
          std::__cxx11::string::string(local_138,local_110);
          std::__cxx11::string::string(local_158,(string *)(local_e9 + 1));
          polyscope::loadStaticMaterial(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          std::__cxx11::string::~string(local_158);
          std::__cxx11::string::~string(local_138);
          std::__cxx11::string::~string(local_110);
          std::__cxx11::string::~string((string *)(local_e9 + 1));
        }
        ImVec2::ImVec2(&local_160,0.0,0.0);
        bVar1 = ImGui::Button((char *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        if (bVar1) {
          in_stack_fffffffffffffc08 =
               (string *)
               std::vector<char,_std::allocator<char>_>::operator[](&buildEngineGui::buffFile,0);
          in_stack_fffffffffffffc10 = (string *)local_181;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_181 + 1),(char *)in_stack_fffffffffffffc08,
                     (allocator *)in_stack_fffffffffffffc10);
          std::allocator<char>::~allocator((allocator<char> *)local_181);
          in_stack_fffffffffffffbf8 =
               (TransparencyMode *)
               std::vector<char,_std::allocator<char>_>::operator[](&buildEngineGui::buffName,0);
          in_stack_fffffffffffffc00 = &local_1a9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1a8,(char *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffc00);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          std::__cxx11::string::string(local_1d0);
          std::__cxx11::string::string(local_1f0);
          std::__cxx11::string::string(local_250,(string *)(local_181 + 1));
          splitExt(in_stack_fffffffffffffc18);
          flags = (ImGuiInputTextFlags)((ulong)&stack0xfffffffffffffda0 >> 0x20);
          std::tie<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
          in_stack_fffffffffffffbf0 = local_230;
          std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffffbb0,
                     (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffba8);
          std::
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x3672e3);
          std::__cxx11::string::~string(local_250);
          std::__cxx11::string::string(local_280,local_1a8);
          std::__cxx11::string::string(local_2a0,local_1d0);
          std::__cxx11::string::string(local_2c0,local_1f0);
          polyscope::loadBlendableMaterial
                    (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
          std::__cxx11::string::~string(local_2c0);
          std::__cxx11::string::~string(local_2a0);
          std::__cxx11::string::~string(local_280);
          std::__cxx11::string::~string(local_1f0);
          std::__cxx11::string::~string(local_1d0);
          std::__cxx11::string::~string(local_1a8);
          std::__cxx11::string::~string((string *)(local_181 + 1));
        }
        ImGui::TreePop();
      }
      ImGui::TreePop();
    }
    bVar1 = ImGui::TreeNode((char *)in_stack_fffffffffffffba8);
    if (bVar1) {
      ImGui::SetNextTreeNodeOpen(false,0x367507);
      bVar1 = ImGui::TreeNode((char *)in_stack_fffffffffffffba8);
      if (bVar1) {
        local_2c8 = (void *)0x200;
        if ((buildEngineGui()::buffName == '\0') &&
           (iVar2 = __cxa_guard_acquire(&buildEngineGui()::buffName), iVar2 != 0)) {
          in_stack_fffffffffffffbe0 = (ImGuiInputTextCallback)(local_2ca + 1);
          in_stack_fffffffffffffbd8 = local_2c8;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
          std::allocator<char>::~allocator((allocator<char> *)(local_2ca + 1));
          __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui()::buffName
                       ,&__dso_handle);
          __cxa_guard_release(&buildEngineGui()::buffName);
        }
        std::vector<char,_std::allocator<char>_>::operator[](&buildEngineGui()::buffName,0);
        ImGui::InputText((char *)in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
                         (size_t)in_stack_fffffffffffffbf0,flags,in_stack_fffffffffffffbe0,
                         in_stack_fffffffffffffbd8);
        if ((buildEngineGui()::buffFile == '\0') &&
           (iVar2 = __cxa_guard_acquire(&buildEngineGui()::buffFile), iVar2 != 0)) {
          this_00 = (vector<char,_std::allocator<char>_> *)local_2ca;
          __n = local_2c8;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    (this_00,(size_type)__n,in_stack_fffffffffffffbc0);
          std::allocator<char>::~allocator((allocator<char> *)local_2ca);
          __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui()::buffFile
                       ,&__dso_handle);
          __cxa_guard_release(&buildEngineGui()::buffFile);
        }
        std::vector<char,_std::allocator<char>_>::operator[](&buildEngineGui()::buffFile,0);
        ImGui::InputText((char *)in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
                         (size_t)in_stack_fffffffffffffbf0,flags,in_stack_fffffffffffffbe0,
                         in_stack_fffffffffffffbd8);
        ImVec2::ImVec2(&local_2d4,0.0,0.0);
        bVar1 = ImGui::Button((char *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        if (bVar1) {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&buildEngineGui()::buffFile,0);
          paVar5 = &local_2f9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f8,pvVar4,paVar5);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&buildEngineGui()::buffName,0);
          paVar5 = &local_321;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_320,pvVar4,paVar5);
          std::allocator<char>::~allocator((allocator<char> *)&local_321);
          std::__cxx11::string::string(local_348,local_320);
          std::__cxx11::string::string(local_368,local_2f8);
          polyscope::loadColorMap(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          std::__cxx11::string::~string(local_368);
          std::__cxx11::string::~string(local_348);
          std::__cxx11::string::~string(local_320);
          std::__cxx11::string::~string(local_2f8);
        }
        ImGui::TreePop();
      }
      ImGui::TreePop();
    }
    ImGui::TreePop();
  }
  return;
}

Assistant:

void Engine::buildEngineGui() {

  ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
  if (ImGui::TreeNode("Appearance")) {

    // == Display
    ImGui::PushItemWidth(120);
    // ImGui::Text("Background");
    // ImGui::SameLine();
    static std::string displayBackgroundName = "None";
    // if (ImGui::BeginCombo("##Background", displayBackgroundName.c_str())) {
    // if (ImGui::Selectable("None", background == BackgroundView::None)) {
    // background = BackgroundView::None;
    // ImGui::SetItemDefaultFocus();
    // displayBackgroundName = "None";
    //}
    // ImGui::EndCombo();
    //}

    ImGui::ColorEdit4("background color", (float*)&view::bgColor, ImGuiColorEditFlags_NoInputs);

    // == Transparency
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Transparency")) {

      if (ImGui::BeginCombo("Mode", modeName(transparencyMode).c_str())) {
        for (TransparencyMode m : {TransparencyMode::None, TransparencyMode::Simple, TransparencyMode::Pretty}) {
          std::string mName = modeName(m);
          if (ImGui::Selectable(mName.c_str(), transparencyMode == m)) {
            options::transparencyMode = m;
            requestRedraw();
          }
        }
        ImGui::EndCombo();
      }

      switch (transparencyMode) {
      case TransparencyMode::None: {
        ImGui::TextWrapped("Transparency effects are disabled and all related options are ignored.");
        break;
      }
      case TransparencyMode::Simple: {
        ImGui::TextWrapped(
            "Simple transparent rendering. Efficient, but objects at different depths may not look right.");
        break;
      }
      case TransparencyMode::Pretty: {
        ImGui::TextWrapped("Accurate but expensive transparent rendering. Increase the number of passes to resolve "
                           "complicated scenes.");
        if (ImGui::InputInt("Render Passes", &options::transparencyRenderPasses)) {
          requestRedraw();
        }
        break;
      }
      }

      ImGui::TreePop();
    }

    // == Ground plane
    groundPlane.buildGui();

    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Tone Mapping")) {
      ImGui::SliderFloat("exposure", &exposure, 0.1, 2.0, "%.3f", 2.);
      ImGui::SliderFloat("white level", &whiteLevel, 0.0, 2.0, "%.3f", 2.);
      ImGui::SliderFloat("gamma", &gamma, 0.5, 3.0, "%.3f", 2.);

      ImGui::TreePop();
    }

    // == Anti-aliasing
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Anti-Aliasing")) {
      if (ImGui::InputInt("SSAA (pretty)", &ssaaFactor, 1)) {
        ssaaFactor = std::min(ssaaFactor, 4);
        ssaaFactor = std::max(ssaaFactor, 1);
        options::ssaaFactor = ssaaFactor;
        requestRedraw();
      }
      ImGui::TreePop();
    }

    // == Materials
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Materials")) {

      ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
      if (ImGui::TreeNode("Load material")) {

        size_t buffLen = 512;
        static std::vector<char> buffName(buffLen);
        ImGui::InputText("Material name", &buffName[0], buffLen);
        static std::vector<char> buffFile(buffLen);
        ImGui::InputText("File name", &buffFile[0], buffLen);

        if (ImGui::Button("Load static material")) {
          std::string filename(&buffFile[0]);
          std::string matName(&buffName[0]);
          polyscope::loadStaticMaterial(matName, filename);
        }

        if (ImGui::Button("Load blendable material")) {
          std::string filename(&buffFile[0]);
          std::string matName(&buffName[0]);
          std::string filebase, fileext;
          std::tie(filebase, fileext) = splitExt(filename);
          polyscope::loadBlendableMaterial(matName, filebase, fileext);
        }

        ImGui::TreePop();
      }

      ImGui::TreePop();
    }

    // == Color maps
    if (ImGui::TreeNode("Color Maps")) {

      ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
      if (ImGui::TreeNode("Load color map")) {

        size_t buffLen = 512;
        static std::vector<char> buffName(buffLen);
        ImGui::InputText("Color map name", &buffName[0], buffLen);
        static std::vector<char> buffFile(buffLen);
        ImGui::InputText("File name", &buffFile[0], buffLen);

        if (ImGui::Button("Load")) {
          std::string filename(&buffFile[0]);
          std::string cmapName(&buffName[0]);
          polyscope::loadColorMap(cmapName, filename);
        }

        ImGui::TreePop();
      }

      ImGui::TreePop();
    }

    ImGui::TreePop();
  }
}